

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O1

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::extract_demand_from_not_empty_queue
          (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,demand_t *dest)

{
  unlimited_demand_queue *queue;
  atomic_refcounted_t *paVar1;
  invocation_type_t iVar2;
  _Elt_pointer pdVar3;
  message_t *pmVar4;
  message_t *pmVar5;
  invocation_type_t __tmp_1;
  type_index __tmp;
  message_t *t;
  composed_action_name local_30;
  
  queue = &this->m_queue;
  details::ensure_queue_not_empty<so_5::mchain_props::details::unlimited_demand_queue&>(queue);
  pdVar3 = (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pmVar4 = (pdVar3->m_message_ref).m_obj;
  (pdVar3->m_message_ref).m_obj = (message_t *)0x0;
  iVar2 = pdVar3->m_demand_type;
  (dest->m_msg_type)._M_target = (pdVar3->m_msg_type)._M_target;
  pmVar5 = (dest->m_message_ref).m_obj;
  (dest->m_message_ref).m_obj = pmVar4;
  dest->m_demand_type = iVar2;
  if (pmVar5 != (message_t *)0x0) {
    LOCK();
    paVar1 = &pmVar5->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if ((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) {
      (*pmVar5->_vptr_message_t[1])();
    }
  }
  details::ensure_queue_not_empty<so_5::mchain_props::details::unlimited_demand_queue&>(queue);
  std::deque<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>::pop_front
            (&queue->m_queue);
  local_30.m_1 = "service_request";
  if (dest->m_demand_type == event) {
    local_30.m_1 = "message";
  }
  local_30.m_2 = "extracted";
  impl::msg_tracing_helpers::details::
  make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            ((this->super_mchain_tracing_enabled_base).m_tracer,
             &this->super_abstract_message_chain_t,&local_30,&dest->m_msg_type,&dest->m_message_ref)
  ;
  return msg_extracted;
}

Assistant:

extraction_status_t
		extract_demand_from_not_empty_queue(
			demand_t & dest )
			{
				// If queue was full then someone can wait on it.
				const bool queue_was_full = m_queue.is_full();
				dest = std::move( m_queue.front() );
				m_queue.pop_front();

				this->trace_extracted_demand( *this, dest );

				if( queue_was_full )
					m_overflow_cond.notify_all();

				return extraction_status_t::msg_extracted;
			}